

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

int move_reading_point(archive_read *a,uint64_t offset)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int64_t iVar4;
  long request;
  
  plVar1 = (long *)a->format->data;
  request = offset - (*plVar1 - plVar1[2]);
  if (request == 0) {
    return 0;
  }
  if (request < 1) {
    iVar4 = __archive_read_seek(a,plVar1[2] + offset,0);
    if (iVar4 != -0x19) {
      *plVar1 = iVar4;
      goto LAB_0014fa83;
    }
    archive_set_error(&a->archive,-1,"Cannot seek.");
    iVar4 = 0xffffffe7;
  }
  else {
    iVar4 = __archive_read_consume(a,request);
    if (-1 < iVar4) {
      *plVar1 = *plVar1 + iVar4;
LAB_0014fa83:
      iVar3 = -0x19;
      bVar2 = true;
      goto LAB_0014fa8a;
    }
  }
  iVar3 = (int)iVar4;
  bVar2 = false;
LAB_0014fa8a:
  if (bVar2) {
    return 0;
  }
  return iVar3;
}

Assistant:

static int
move_reading_point(struct archive_read *a, uint64_t offset)
{
	struct xar *xar;

	xar = (struct xar *)(a->format->data);
	if (xar->offset - xar->h_base != offset) {
		/* Seek forward to the start of file contents. */
		int64_t step;

		step = offset - (xar->offset - xar->h_base);
		if (step > 0) {
			step = __archive_read_consume(a, step);
			if (step < 0)
				return ((int)step);
			xar->offset += step;
		} else {
			int64_t pos = __archive_read_seek(a, xar->h_base + offset, SEEK_SET);
			if (pos == ARCHIVE_FAILED) {
				archive_set_error(&(a->archive),
				    ARCHIVE_ERRNO_MISC,
				    "Cannot seek.");
				return (ARCHIVE_FAILED);
			}
			xar->offset = pos;
		}
	}
	return (ARCHIVE_OK);
}